

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weibull_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::weibull_dist<float>::operator()(weibull_dist<float> *this,lcg64_shift *r)

{
  param_type *in_RDI;
  result_type_conflict1 rVar1;
  float fVar2;
  result_type_conflict1 rVar3;
  double dVar4;
  
  rVar1 = param_type::theta(in_RDI);
  utility::uniformoc<float,trng::lcg64_shift>((lcg64_shift *)0x3214dd);
  fVar2 = math::ln(0.0);
  rVar3 = param_type::beta(in_RDI);
  dVar4 = std::pow((double)(ulong)(uint)-fVar2,(double)(ulong)(uint)(1.0 / rVar3));
  return rVar1 * SUB84(dVar4,0);
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return P.theta() * math::pow(-math::ln(utility::uniformoc<result_type>(r)), 1 / P.beta());
    }